

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall
QWizardField::findProperty(QWizardField *this,QWizardDefaultProperty *properties,int propertyCount)

{
  QWizardDefaultProperty *rhs;
  bool bVar1;
  bool bVar2;
  long *plVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QByteArray local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char *)0x0;
  local_58.d.size = 0;
  if (0 < propertyCount) {
    uVar4 = 0;
    do {
      plVar3 = (long *)(*(code *)**(undefined8 **)this->object)();
      if (plVar3 != (long *)0x0) {
        rhs = properties + uVar4;
        do {
          local_40 = (char *)QMetaObject::className();
          bVar1 = ::operator==(&local_40,&rhs->className);
          if (bVar1) goto LAB_00512a8c;
          local_40 = (char *)QMetaObject::className();
          bVar2 = ::operator==(&local_40,&local_58);
        } while ((!bVar2) && (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0));
        if (bVar1) {
LAB_00512a8c:
          QByteArray::operator=(&local_58,&rhs->className);
          QByteArray::operator=(&this->property,&rhs->property);
          QByteArray::operator=(&this->changedSignal,&rhs->changedSignal);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)propertyCount);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardField::findProperty(const QWizardDefaultProperty *properties, int propertyCount)
{
    QByteArray className;

    for (int i = 0; i < propertyCount; ++i) {
        if (objectInheritsXAndXIsCloserThanY(object, properties[i].className, className)) {
            className = properties[i].className;
            property = properties[i].property;
            changedSignal = properties[i].changedSignal;
        }
    }
}